

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O0

void __thiscall QEvdevTabletManager::~QEvdevTabletManager(QEvdevTabletManager *this)

{
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0011c570;
  QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::~DeviceHandlerList
            ((DeviceHandlerList<QEvdevTabletHandlerThread> *)0x10752e);
  QString::~QString((QString *)0x10753c);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

QEvdevTabletManager::~QEvdevTabletManager()
{
}